

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseKernel.cc
# Opt level: O0

void __thiscall OpenMesh::BaseKernel::vprop_stats(BaseKernel *this,ostream *_ostr)

{
  bool bVar1;
  reference ppBVar2;
  ostream *poVar3;
  __normal_iterator<OpenMesh::BaseProperty_*const_*,_std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>_>
  local_38;
  BaseProperty **local_30;
  Properties *local_28;
  Properties *vps;
  const_iterator it;
  ostream *_ostr_local;
  BaseKernel *this_local;
  
  it._M_current = (BaseProperty **)_ostr;
  __gnu_cxx::
  __normal_iterator<OpenMesh::BaseProperty_*const_*,_std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>_>
  ::__normal_iterator((__normal_iterator<OpenMesh::BaseProperty_*const_*,_std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>_>
                       *)&vps);
  local_28 = PropertyContainer::properties(&this->vprops_);
  local_30 = (BaseProperty **)
             std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>::begin
                       (local_28);
  vps = (Properties *)local_30;
  while( true ) {
    local_38._M_current =
         (BaseProperty **)
         std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>::end
                   (local_28);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<OpenMesh::BaseProperty_*const_*,_std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>_>
                        *)&vps,&local_38);
    if (!bVar1) break;
    ppBVar2 = __gnu_cxx::
              __normal_iterator<OpenMesh::BaseProperty_*const_*,_std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>_>
              ::operator*((__normal_iterator<OpenMesh::BaseProperty_*const_*,_std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>_>
                           *)&vps);
    if (*ppBVar2 == (BaseProperty *)0x0) {
      poVar3 = std::operator<<((ostream *)it._M_current,"[deleted]");
      std::operator<<(poVar3,"\n");
    }
    else {
      ppBVar2 = __gnu_cxx::
                __normal_iterator<OpenMesh::BaseProperty_*const_*,_std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>_>
                ::operator*((__normal_iterator<OpenMesh::BaseProperty_*const_*,_std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>_>
                             *)&vps);
      (*(*ppBVar2)->_vptr_BaseProperty[9])(*ppBVar2,it._M_current);
    }
    __gnu_cxx::
    __normal_iterator<OpenMesh::BaseProperty_*const_*,_std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>_>
    ::operator++((__normal_iterator<OpenMesh::BaseProperty_*const_*,_std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>_>
                  *)&vps);
  }
  return;
}

Assistant:

void BaseKernel::vprop_stats(std::ostream& _ostr ) const
{
  PropertyContainer::Properties::const_iterator it;
  const PropertyContainer::Properties& vps = vprops_.properties();
  for (it=vps.begin(); it!=vps.end(); ++it)
    *it == NULL ? (void)(_ostr << "[deleted]" << "\n") : (*it)->stats(_ostr);

}